

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::clear_ValueOnUnknown(CategoricalMapping *this)

{
  undefined8 *puVar1;
  
  if ((this->_oneof_case_[1] == 0x65) &&
     (puVar1 = (undefined8 *)(this->ValueOnUnknown_).int64value_,
     puVar1 != &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] + 1);
      }
    }
    operator_delete(puVar1,0x20);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_ValueOnUnknown() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (ValueOnUnknown_case()) {
    case kStrValue: {
      ValueOnUnknown_.strvalue_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kInt64Value: {
      // No need to clear
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = VALUEONUNKNOWN_NOT_SET;
}